

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotated_binary_text_gen.cpp
# Opt level: O0

bool __thiscall
flatbuffers::AnnotatedBinaryTextGenerator::Generate
          (AnnotatedBinaryTextGenerator *this,string *filename,string *schema_filename,
          string *output_filename)

{
  bool bVar1;
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> *this_00;
  map<unsigned_long,_flatbuffers::BinarySection,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>_>
  *pmVar2;
  ulong uVar3;
  char *pcVar4;
  ostream *poVar5;
  reference ppVar6;
  BinaryRegion *region_00;
  OutputConfig *in_R8;
  int local_390;
  int local_38c;
  pair<const_unsigned_long,_flatbuffers::BinarySection> *section_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  map<unsigned_long,_flatbuffers::BinarySection,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>_>
  *__range1_1;
  ofstream ofs;
  string local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  string local_120;
  string local_100 [8];
  string out;
  string local_d0;
  undefined1 local_b0 [8];
  string s;
  BinaryRegion *region;
  const_iterator __end2;
  const_iterator __begin2;
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> *__range2;
  pair<const_unsigned_long,_flatbuffers::BinarySection> *section;
  const_iterator __end1;
  const_iterator __begin1;
  map<unsigned_long,_flatbuffers::BinarySection,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>_>
  *__range1;
  OutputConfig output_config;
  string *output_filename_local;
  string *schema_filename_local;
  string *filename_local;
  AnnotatedBinaryTextGenerator *this_local;
  
  output_config._32_8_ = output_filename;
  anon_unknown_7::OutputConfig::OutputConfig((OutputConfig *)&__range1);
  output_config.largest_value_string = (this->options_).max_bytes_per_line;
  output_config.offset_max_char._1_1_ = (this->options_).include_vector_contents & 1;
  if (this->binary_length_ < 0x1000000) {
    if (this->binary_length_ < 0x10000) {
      local_390 = 2;
      if (0xff < this->binary_length_) {
        local_390 = 4;
      }
    }
    else {
      local_390 = 6;
    }
    local_38c = local_390;
  }
  else {
    local_38c = 8;
  }
  output_config.max_bytes_per_line = (size_t)local_38c;
  __range1 = (map<unsigned_long,_flatbuffers::BinarySection,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>_>
              *)0x0;
  __end1 = std::
           map<unsigned_long,_flatbuffers::BinarySection,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>_>
           ::begin(&this->annotations_);
  section = (pair<const_unsigned_long,_flatbuffers::BinarySection> *)
            std::
            map<unsigned_long,_flatbuffers::BinarySection,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>_>
            ::end(&this->annotations_);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&section), bVar1) {
    ppVar6 = std::
             _Rb_tree_const_iterator<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>::
             operator*(&__end1);
    this_00 = &(ppVar6->second).regions;
    __end2 = std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
             begin(this_00);
    region = (BinaryRegion *)
             std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::end
                       (this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_flatbuffers::BinaryRegion_*,_std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>_>
                                       *)&region), bVar1) {
      s.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<const_flatbuffers::BinaryRegion_*,_std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>_>
           ::operator*(&__end2);
      (anonymous_namespace)::GenerateTypeString_abi_cxx11_
                ((string *)local_b0,(_anonymous_namespace_ *)s.field_2._8_8_,region_00);
      pmVar2 = (map<unsigned_long,_flatbuffers::BinarySection,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>_>
                *)std::__cxx11::string::size();
      if (__range1 < pmVar2) {
        __range1 = (map<unsigned_long,_flatbuffers::BinarySection,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>_>
                    *)std::__cxx11::string::size();
      }
      if (*(long *)(s.field_2._8_8_ + 0x18) == 0) {
        (anonymous_namespace)::ToValueString_abi_cxx11_
                  (&local_d0,(_anonymous_namespace_ *)s.field_2._8_8_,(BinaryRegion *)this->binary_,
                   (uint8_t *)&__range1,in_R8);
        std::__cxx11::string::operator=((string *)local_b0,(string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_d0);
        uVar3 = std::__cxx11::string::size();
        if (output_config.largest_type_string < uVar3) {
          output_config.largest_type_string = std::__cxx11::string::size();
        }
      }
      std::__cxx11::string::~string((string *)local_b0);
      __gnu_cxx::
      __normal_iterator<const_flatbuffers::BinaryRegion_*,_std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>_>
      ::operator++(&__end2);
    }
    std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>::
    operator++(&__end1);
  }
  std::__cxx11::string::string(local_100,(string *)output_config._32_8_);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) != 0) {
    StripExtension(&local_120,filename);
    std::__cxx11::string::operator=(local_100,(string *)&local_120);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::operator+=(local_100,(string *)&(this->options_).output_postfix);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      std::__cxx11::string::string
                ((string *)&local_160,(string *)&(this->options_).output_extension);
    }
    else {
      GetExtension(&local_160,filename);
    }
    std::operator+(&local_140,".",&local_160);
    std::__cxx11::string::operator+=(local_100,(string *)&local_140);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&local_160);
  }
  pcVar4 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(&__range1_1,pcVar4,_S_out);
  poVar5 = std::operator<<((ostream *)&__range1_1,"// Annotated Flatbuffer Binary");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)&__range1_1,"//");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    poVar5 = std::operator<<((ostream *)&__range1_1,"// Schema file: ");
    poVar5 = std::operator<<(poVar5,(string *)schema_filename);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  poVar5 = std::operator<<((ostream *)&__range1_1,"// Binary file: ");
  poVar5 = std::operator<<(poVar5,(string *)filename);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  __end1_1 = std::
             map<unsigned_long,_flatbuffers::BinarySection,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>_>
             ::begin(&this->annotations_);
  section_1 = (pair<const_unsigned_long,_flatbuffers::BinarySection> *)
              std::
              map<unsigned_long,_flatbuffers::BinarySection,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>_>
              ::end(&this->annotations_);
  while (bVar1 = std::operator!=(&__end1_1,(_Self *)&section_1), bVar1) {
    ppVar6 = std::
             _Rb_tree_const_iterator<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>::
             operator*(&__end1_1);
    anon_unknown_7::GenerateSection
              ((ostream *)&__range1_1,&ppVar6->second,this->binary_,(OutputConfig *)&__range1);
    std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>::
    operator++(&__end1_1);
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&__range1_1);
  std::__cxx11::string::~string(local_100);
  return true;
}

Assistant:

bool AnnotatedBinaryTextGenerator::Generate(
    const std::string &filename, const std::string &schema_filename,
    const std::string &output_filename) {
  OutputConfig output_config;
  output_config.max_bytes_per_line = options_.max_bytes_per_line;
  output_config.include_vector_contents = options_.include_vector_contents;

  // Given the length of the binary, we can calculate the maximum number of
  // characters to display in the offset hex: (i.e. 2 would lead to 0XFF being
  // the max output).
  output_config.offset_max_char =
      binary_length_ > 0xFFFFFF
          ? 8
          : (binary_length_ > 0xFFFF ? 6 : (binary_length_ > 0xFF ? 4 : 2));

  // Find the largest type string of all the regions in this file, so we can
  // align the output nicely.
  output_config.largest_type_string = 0;
  for (const auto &section : annotations_) {
    for (const auto &region : section.second.regions) {
      std::string s = GenerateTypeString(region);
      if (s.size() > output_config.largest_type_string) {
        output_config.largest_type_string = s.size();
      }

      // Don't consider array regions, as they will be split to multiple lines.
      if (!region.array_length) {
        s = ToValueString(region, binary_, output_config);
        if (s.size() > output_config.largest_value_string) {
          output_config.largest_value_string = s.size();
        }
      }
    }
  }

  std::string out = output_filename;
  if (out.empty()) {
    // Modify the output filename.
    out = StripExtension(filename);
    out += options_.output_postfix;
    out +=
        "." + (options_.output_extension.empty() ? GetExtension(filename)
                                                 : options_.output_extension);
  }

  std::ofstream ofs(out.c_str());

  ofs << "// Annotated Flatbuffer Binary" << std::endl;
  ofs << "//" << std::endl;
  if (!schema_filename.empty()) {
    ofs << "// Schema file: " << schema_filename << std::endl;
  }
  ofs << "// Binary file: " << filename << std::endl;

  // Generate each of the binary sections
  for (const auto &section : annotations_) {
    GenerateSection(ofs, section.second, binary_, output_config);
  }

  ofs.close();
  return true;
}